

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerMSL::add_tess_level_input_to_interface_block
          (CompilerMSL *this,string *ib_var_ref,SPIRType *ib_type,SPIRVariable *var)

{
  ID *__k;
  ID id;
  uint32_t uVar1;
  undefined8 uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t id_00;
  SPIRFunction *this_00;
  SPIRType *pSVar5;
  SPIREntryPoint *pSVar6;
  mapped_type *pmVar7;
  Bitset *pBVar8;
  size_type sVar9;
  mapped_type *pmVar10;
  _func_void *p_Var11;
  string *this_01;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  string mbr_name;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  undefined8 uStack_68;
  string qual_var_name;
  
  this_00 = Compiler::get<spirv_cross::SPIRFunction>
                      ((Compiler *)this,
                       (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id);
  pSVar5 = Compiler::get_variable_element_type((Compiler *)this,var);
  uVar3 = Compiler::get_decoration
                    ((Compiler *)this,(ID)(var->super_IVariant).self.id,DecorationBuiltIn);
  id.id = (var->super_IVariant).self.id;
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])(&mbr_name,this);
  Compiler::set_name((Compiler *)this,id,&mbr_name);
  __k = &(var->super_IVariant).self;
  ::std::__cxx11::string::~string((string *)&mbr_name);
  pSVar6 = Compiler::get_entry_point((Compiler *)this);
  if (((pSVar6->flags).lower & 0x400000) == 0) {
    uVar1 = (uint32_t)
            (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size;
    uVar4 = build_extended_vector_type
                      (this,(pSVar5->super_IVariant).self.id,(uint)(uVar3 == 0xb) * 2 + 2,Unknown);
    id_00 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
    pSVar5 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar4);
    pSVar5 = Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                       ((Compiler *)this,id_00,pSVar5);
    pSVar5->pointer = true;
    pSVar5->storage = StorageClassInput;
    (pSVar5->parent_type).id = uVar4;
    *(uint32_t *)&(var->super_IVariant).field_0xc = id_00;
    mbr_name._M_dataplus._M_p._0_4_ = uVar4;
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
              (&ib_type->member_types,(TypedID<(spirv_cross::Types)1> *)&mbr_name);
    CompilerGLSL::to_expression_abi_cxx11_
              (&mbr_name,&this->super_CompilerGLSL,(var->super_IVariant).self.id,true);
    Compiler::set_member_name
              ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar1,&mbr_name);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                     ib_var_ref,".");
    ::std::operator+(&qual_var_name,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d8,
                     &mbr_name);
    ::std::__cxx11::string::~string((string *)local_d8._M_pod_data);
    pmVar7 = ::std::__detail::
             _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&(this->super_CompilerGLSL).super_Compiler.ir.meta,__k);
    ::std::__cxx11::string::_M_assign((string *)&(pmVar7->decoration).qualified_alias);
    pBVar8 = Compiler::get_decoration_bitset((Compiler *)this,(ID)__k->id);
    if ((pBVar8->lower & 0x40000000) == 0) {
      local_d8._0_4_ = uVar3;
      sVar9 = ::std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::count(&(this->inputs_by_builtin)._M_h,(key_type *)local_d8._M_pod_data);
      if (sVar9 != 0) {
        pmVar10 = ::std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&this->inputs_by_builtin,(key_type *)local_d8._M_pod_data);
        uVar3 = pmVar10->location;
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar1,
                   DecorationLocation,uVar3);
        mark_location_as_used_by_shader(this,uVar3,pSVar5,StorageClassInput);
      }
    }
    else {
      uVar3 = Compiler::get_decoration((Compiler *)this,(ID)__k->id,DecorationLocation);
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar1,DecorationLocation
                 ,uVar3);
      mark_location_as_used_by_shader(this,uVar3,pSVar5,StorageClassInput);
    }
    ::std::__cxx11::string::~string((string *)&qual_var_name);
    this_01 = &mbr_name;
  }
  else {
    SPIRFunction::add_local_variable(this_00,(VariableID)__k->id);
    mbr_name._M_dataplus._M_p._0_4_ = __k->id;
    SmallVector<unsigned_int,_8UL>::push_back
              (&this->vars_needing_early_declaration,(uint *)&mbr_name);
    ::std::__cxx11::string::string((string *)&qual_var_name,"gl_TessLevel",(allocator *)&mbr_name);
    if (this->added_builtin_tess_level == false) {
      uVar1 = (uint32_t)
              (ib_type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
              .buffer_size;
      uVar4 = build_extended_vector_type(this,(pSVar5->super_IVariant).self.id,4,Unknown);
      mbr_name._M_dataplus._M_p._0_4_ = uVar4;
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
                (&ib_type->member_types,(TypedID<(spirv_cross::Types)1> *)&mbr_name);
      Compiler::set_member_name
                ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar1,&qual_var_name);
      pBVar8 = Compiler::get_decoration_bitset((Compiler *)this,(ID)__k->id);
      if ((pBVar8->lower & 0x40000000) == 0) {
        mbr_name._M_dataplus._M_p._0_4_ = uVar3;
        sVar9 = ::std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::count(&(this->inputs_by_builtin)._M_h,(key_type *)&mbr_name);
        if (sVar9 != 0) {
          pmVar10 = ::std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)&this->inputs_by_builtin,(key_type *)&mbr_name);
          uVar4 = pmVar10->location;
          Compiler::set_member_decoration
                    ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar1,
                     DecorationLocation,uVar4);
          mark_location_as_used_by_shader(this,uVar4,pSVar5,StorageClassInput);
        }
      }
      else {
        uVar4 = Compiler::get_decoration((Compiler *)this,(ID)__k->id,DecorationLocation);
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,uVar1,
                   DecorationLocation,uVar4);
        mark_location_as_used_by_shader(this,uVar4,pSVar5,StorageClassInput);
      }
      this->added_builtin_tess_level = true;
    }
    mbr_name._M_string_length = (size_type)this;
    if (uVar3 == 0xc) {
      mbr_name._M_dataplus._M_p = (pointer)var;
      ::std::__cxx11::string::string((string *)mbr_name.field_2._M_local_buf,(string *)ib_var_ref);
      ::std::__cxx11::string::string((string *)&local_80,(string *)&qual_var_name);
      local_c8 = (code *)0x0;
      pcStack_c0 = (code *)0x0;
      local_d8._M_unused._M_object = (void *)0x0;
      local_d8._8_8_ = 0;
      p_Var11 = (_func_void *)operator_new(0x50);
      *(pointer *)p_Var11 = mbr_name._M_dataplus._M_p;
      *(size_type *)(p_Var11 + 8) = mbr_name._M_string_length;
      ::std::__cxx11::string::string
                ((string *)(p_Var11 + 0x10),(string *)mbr_name.field_2._M_local_buf);
      uVar2 = local_78;
      *(_func_void **)(p_Var11 + 0x30) = p_Var11 + 0x40;
      if (local_80 == &local_70) {
        *(ulong *)(p_Var11 + 0x40) = CONCAT71(uStack_6f,local_70);
        *(undefined8 *)(p_Var11 + 0x48) = uStack_68;
      }
      else {
        *(undefined1 **)(p_Var11 + 0x30) = local_80;
        *(ulong *)(p_Var11 + 0x40) = CONCAT71(uStack_6f,local_70);
      }
      local_78 = 0;
      *(undefined8 *)(p_Var11 + 0x38) = uVar2;
      local_70 = 0;
      pcStack_c0 = ::std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp:2440:8)>
                   ::_M_invoke;
      local_c8 = ::std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp:2440:8)>
                 ::_M_manager;
      local_d8._M_unused._0_8_ = (undefined8)p_Var11;
      local_80 = &local_70;
      SmallVector<std::function<void_()>,_0UL>::push_back
                (&this_00->fixup_hooks_in,(function<void_()> *)&local_d8);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_d8);
      add_tess_level_input_to_interface_block(std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&)
      ::$_1::~__1((__1 *)&mbr_name);
    }
    else {
      if (uVar3 != 0xb) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0x98c,
                      "void spirv_cross::CompilerMSL::add_tess_level_input_to_interface_block(const std::string &, SPIRType &, SPIRVariable &)"
                     );
      }
      mbr_name._M_dataplus._M_p = (pointer)var;
      ::std::__cxx11::string::string((string *)mbr_name.field_2._M_local_buf,(string *)ib_var_ref);
      ::std::__cxx11::string::string((string *)&local_80,(string *)&qual_var_name);
      local_c8 = (code *)0x0;
      pcStack_c0 = (code *)0x0;
      local_d8._M_unused._M_object = (void *)0x0;
      local_d8._8_8_ = 0;
      p_Var11 = (_func_void *)operator_new(0x50);
      *(pointer *)p_Var11 = mbr_name._M_dataplus._M_p;
      *(size_type *)(p_Var11 + 8) = mbr_name._M_string_length;
      ::std::__cxx11::string::string
                ((string *)(p_Var11 + 0x10),(string *)mbr_name.field_2._M_local_buf);
      uVar2 = local_78;
      *(_func_void **)(p_Var11 + 0x30) = p_Var11 + 0x40;
      if (local_80 == &local_70) {
        *(ulong *)(p_Var11 + 0x40) = CONCAT71(uStack_6f,local_70);
        *(undefined8 *)(p_Var11 + 0x48) = uStack_68;
      }
      else {
        *(undefined1 **)(p_Var11 + 0x30) = local_80;
        *(ulong *)(p_Var11 + 0x40) = CONCAT71(uStack_6f,local_70);
      }
      local_78 = 0;
      *(undefined8 *)(p_Var11 + 0x38) = uVar2;
      local_70 = 0;
      pcStack_c0 = ::std::
                   _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp:2431:40)>
                   ::_M_invoke;
      local_c8 = ::std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp:2431:40)>
                 ::_M_manager;
      local_d8._M_unused._0_8_ = (undefined8)p_Var11;
      local_80 = &local_70;
      SmallVector<std::function<void_()>,_0UL>::push_back
                (&this_00->fixup_hooks_in,(function<void_()> *)&local_d8);
      ::std::_Function_base::~_Function_base((_Function_base *)&local_d8);
      add_tess_level_input_to_interface_block(std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&)
      ::$_0::~__0((__0 *)&mbr_name);
    }
    this_01 = &qual_var_name;
  }
  ::std::__cxx11::string::~string((string *)this_01);
  return;
}

Assistant:

void CompilerMSL::add_tess_level_input_to_interface_block(const std::string &ib_var_ref, SPIRType &ib_type,
                                                          SPIRVariable &var)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	auto &var_type = get_variable_element_type(var);

	BuiltIn builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));

	// Force the variable to have the proper name.
	set_name(var.self, builtin_to_glsl(builtin, StorageClassFunction));

	if (get_entry_point().flags.get(ExecutionModeTriangles))
	{
		// Triangles are tricky, because we want only one member in the struct.

		// We need to declare the variable early and at entry-point scope.
		entry_func.add_local_variable(var.self);
		vars_needing_early_declaration.push_back(var.self);

		string mbr_name = "gl_TessLevel";

		// If we already added the other one, we can skip this step.
		if (!added_builtin_tess_level)
		{
			// Add a reference to the variable type to the interface struct.
			uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());

			uint32_t type_id = build_extended_vector_type(var_type.self, 4);

			ib_type.member_types.push_back(type_id);

			// Give the member a name
			set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

			// There is no qualified alias since we need to flatten the internal array on return.
			if (get_decoration_bitset(var.self).get(DecorationLocation))
			{
				uint32_t locn = get_decoration(var.self, DecorationLocation);
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
				mark_location_as_used_by_shader(locn, var_type, StorageClassInput);
			}
			else if (inputs_by_builtin.count(builtin))
			{
				uint32_t locn = inputs_by_builtin[builtin].location;
				set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
				mark_location_as_used_by_shader(locn, var_type, StorageClassInput);
			}

			added_builtin_tess_level = true;
		}

		switch (builtin)
		{
		case BuiltInTessLevelOuter:
			entry_func.fixup_hooks_in.push_back([=, &var]() {
				statement(to_name(var.self), "[0] = ", ib_var_ref, ".", mbr_name, ".x;");
				statement(to_name(var.self), "[1] = ", ib_var_ref, ".", mbr_name, ".y;");
				statement(to_name(var.self), "[2] = ", ib_var_ref, ".", mbr_name, ".z;");
			});
			break;

		case BuiltInTessLevelInner:
			entry_func.fixup_hooks_in.push_back(
			    [=, &var]() { statement(to_name(var.self), "[0] = ", ib_var_ref, ".", mbr_name, ".w;"); });
			break;

		default:
			assert(false);
			break;
		}
	}
	else
	{
		// Add a reference to the variable type to the interface struct.
		uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());

		uint32_t type_id = build_extended_vector_type(var_type.self, builtin == BuiltInTessLevelOuter ? 4 : 2);
		// Change the type of the variable, too.
		uint32_t ptr_type_id = ir.increase_bound_by(1);
		auto &new_var_type = set<SPIRType>(ptr_type_id, get<SPIRType>(type_id));
		new_var_type.pointer = true;
		new_var_type.storage = StorageClassInput;
		new_var_type.parent_type = type_id;
		var.basetype = ptr_type_id;

		ib_type.member_types.push_back(type_id);

		// Give the member a name
		string mbr_name = to_expression(var.self);
		set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

		// Since vectors can be indexed like arrays, there is no need to unpack this. We can
		// just refer to the vector directly. So give it a qualified alias.
		string qual_var_name = ib_var_ref + "." + mbr_name;
		ir.meta[var.self].decoration.qualified_alias = qual_var_name;

		if (get_decoration_bitset(var.self).get(DecorationLocation))
		{
			uint32_t locn = get_decoration(var.self, DecorationLocation);
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
			mark_location_as_used_by_shader(locn, new_var_type, StorageClassInput);
		}
		else if (inputs_by_builtin.count(builtin))
		{
			uint32_t locn = inputs_by_builtin[builtin].location;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
			mark_location_as_used_by_shader(locn, new_var_type, StorageClassInput);
		}
	}
}